

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int find_private_class_field(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_level)

{
  int idx;
  int scope_level_local;
  JSAtom name_local;
  JSFunctionDef *fd_local;
  JSContext *ctx_local;
  
  idx = fd->scopes[scope_level].first;
  while ((idx != -1 && (fd->vars[idx].scope_level == scope_level))) {
    if (fd->vars[idx].var_name == name) {
      return idx;
    }
    idx = fd->vars[idx].scope_next;
  }
  return -1;
}

Assistant:

static int find_private_class_field(JSContext *ctx, JSFunctionDef *fd,
                                    JSAtom name, int scope_level)
{
    int idx;
    idx = fd->scopes[scope_level].first;
    while (idx != -1) {
        if (fd->vars[idx].scope_level != scope_level)
            break;
        if (fd->vars[idx].var_name == name)
            return idx;
        idx = fd->vars[idx].scope_next;
    }
    return -1;
}